

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitSwitch(InternalAnalyzer *this,Switch *curr)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auStack_48 [8];
  Name name;
  
  uVar1 = *(ulong *)(curr + 0x18);
  if (uVar1 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (*(ulong *)(curr + 0x18) <= uVar3) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                     );
      }
      auStack_48 = *(undefined1 (*) [8])(*(long *)(curr + 0x10) + lVar2);
      name.super_IString.str._M_len = ((size_t *)(*(long *)(curr + 0x10) + lVar2))[1];
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&this->parent->breakTargets,(Name *)auStack_48);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 != uVar3);
  }
  std::
  _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
  ::_M_insert_unique<wasm::Name_const&>
            ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
              *)&this->parent->breakTargets,(Name *)(curr + 0x30));
  return;
}

Assistant:

void visitSwitch(Switch* curr) {
      for (auto name : curr->targets) {
        parent.breakTargets.insert(name);
      }
      parent.breakTargets.insert(curr->default_);
    }